

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

void icu_63::number::impl::blueprint_helpers::parseMeasureUnitOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  char16_t *pcVar6;
  char *pcVar7;
  char *__s2;
  bool bVar8;
  MeasureUnit *local_520;
  MeasureUnit *local_4c0;
  MeasureUnit *unit;
  int32_t i;
  int32_t numUnits;
  UErrorCode localStatus;
  MeasureUnit units [30];
  UnicodeString local_190;
  UErrorCode local_14c;
  undefined1 local_148 [4];
  UErrorCode conversionStatus_1;
  CharString subType;
  UnicodeString local_100;
  UErrorCode local_bc;
  undefined1 local_b8 [4];
  UErrorCode conversionStatus;
  CharString type;
  uint local_64;
  undefined1 local_60 [4];
  int firstHyphen;
  UnicodeString stemString;
  UErrorCode *status_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  stemString.fUnion._48_8_ = status;
  numparse::impl::StringSegment::toTempUnicodeString((UnicodeString *)local_60,segment);
  local_64 = 0;
  while( true ) {
    iVar3 = UnicodeString::length((UnicodeString *)local_60);
    bVar8 = false;
    if ((int)local_64 < iVar3) {
      cVar2 = UnicodeString::charAt((UnicodeString *)local_60,local_64);
      bVar8 = cVar2 != L'-';
    }
    if (!bVar8) break;
    local_64 = local_64 + 1;
  }
  uVar4 = UnicodeString::length((UnicodeString *)local_60);
  if (local_64 == uVar4) {
    *(undefined4 *)stemString.fUnion._48_8_ = 0x10113;
    type.len = 1;
  }
  else {
    CharString::CharString((CharString *)local_b8);
    local_bc = U_ZERO_ERROR;
    pcVar6 = UnicodeString::getBuffer((UnicodeString *)local_60);
    ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&subType.len,pcVar6);
    UnicodeString::UnicodeString(&local_100,'\0',(ConstChar16Ptr *)&subType.len,local_64);
    CharString::appendInvariantChars((CharString *)local_b8,&local_100,&local_bc);
    UnicodeString::~UnicodeString(&local_100);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&subType.len);
    if (local_bc == U_INVARIANT_CONVERSION_ERROR) {
      *(undefined4 *)stemString.fUnion._48_8_ = 0x10113;
      type.len = 1;
    }
    else {
      UVar1 = ::U_FAILURE(local_bc);
      if (UVar1 == '\0') {
        CharString::CharString((CharString *)local_148);
        local_14c = U_ZERO_ERROR;
        pcVar6 = UnicodeString::getBuffer((UnicodeString *)local_60);
        ConstChar16Ptr::ConstChar16Ptr
                  ((ConstChar16Ptr *)units[0x1d].fCurrency,pcVar6 + (long)(int)local_64 + 1);
        iVar3 = UnicodeString::length((UnicodeString *)local_60);
        UnicodeString::UnicodeString
                  (&local_190,'\0',(ConstChar16Ptr *)units[0x1d].fCurrency,~local_64 + iVar3);
        CharString::appendInvariantChars((CharString *)local_148,&local_190,&local_14c);
        UnicodeString::~UnicodeString(&local_190);
        ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)units[0x1d].fCurrency);
        if (local_14c == U_INVARIANT_CONVERSION_ERROR) {
          *(undefined4 *)stemString.fUnion._48_8_ = 0x10113;
          type.len = 1;
        }
        else {
          UVar1 = ::U_FAILURE(local_14c);
          if (UVar1 == '\0') {
            local_4c0 = (MeasureUnit *)&numUnits;
            do {
              MeasureUnit::MeasureUnit(local_4c0);
              local_4c0 = local_4c0 + 1;
            } while (local_4c0 != (MeasureUnit *)units[0x1d].fCurrency);
            i = 0;
            pcVar7 = CharString::data((CharString *)local_b8);
            iVar3 = MeasureUnit::getAvailable(pcVar7,(MeasureUnit *)&numUnits,0x1e,&i);
            UVar1 = ::U_FAILURE(i);
            if (UVar1 == '\0') {
              for (unit._4_4_ = 0; unit._4_4_ < iVar3; unit._4_4_ = unit._4_4_ + 1) {
                pcVar7 = CharString::data((CharString *)local_148);
                __s2 = MeasureUnit::getSubtype((MeasureUnit *)(&numUnits + (long)unit._4_4_ * 6));
                iVar5 = strcmp(pcVar7,__s2);
                if (iVar5 == 0) {
                  MeasureUnit::operator=
                            (&macros->unit,(MeasureUnit *)(&numUnits + (long)unit._4_4_ * 6));
                  type.len = 1;
                  goto LAB_002f3e40;
                }
              }
              *(undefined4 *)stemString.fUnion._48_8_ = 0x10113;
              type.len = 0;
            }
            else {
              *(undefined4 *)stemString.fUnion._48_8_ = 5;
              type.len = 1;
            }
LAB_002f3e40:
            local_520 = (MeasureUnit *)units[0x1d].fCurrency;
            do {
              local_520 = local_520 + -1;
              MeasureUnit::~MeasureUnit(local_520);
            } while (local_520 != (MeasureUnit *)&numUnits);
          }
          else {
            *(UErrorCode *)stemString.fUnion._48_8_ = local_14c;
            type.len = 1;
          }
        }
        CharString::~CharString((CharString *)local_148);
      }
      else {
        *(UErrorCode *)stemString.fUnion._48_8_ = local_bc;
        type.len = 1;
      }
    }
    CharString::~CharString((CharString *)local_b8);
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_60);
  return;
}

Assistant:

void blueprint_helpers::parseMeasureUnitOption(const StringSegment& segment, MacroProps& macros,
                                               UErrorCode& status) {
    const UnicodeString stemString = segment.toTempUnicodeString();

    // NOTE: The category (type) of the unit is guaranteed to be a valid subtag (alphanumeric)
    // http://unicode.org/reports/tr35/#Validity_Data
    int firstHyphen = 0;
    while (firstHyphen < stemString.length() && stemString.charAt(firstHyphen) != '-') {
        firstHyphen++;
    }
    if (firstHyphen == stemString.length()) {
        // throw new SkeletonSyntaxException("Invalid measure unit option", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }

    // Need to do char <-> UChar conversion...
    U_ASSERT(U_SUCCESS(status));
    CharString type;
    SKELETON_UCHAR_TO_CHAR(type, stemString, 0, firstHyphen, status);
    CharString subType;
    SKELETON_UCHAR_TO_CHAR(subType, stemString, firstHyphen + 1, stemString.length(), status);

    // Note: the largest type as of this writing (March 2018) is "volume", which has 24 units.
    static constexpr int32_t CAPACITY = 30;
    MeasureUnit units[CAPACITY];
    UErrorCode localStatus = U_ZERO_ERROR;
    int32_t numUnits = MeasureUnit::getAvailable(type.data(), units, CAPACITY, localStatus);
    if (U_FAILURE(localStatus)) {
        // More than 30 units in this type?
        status = U_INTERNAL_PROGRAM_ERROR;
        return;
    }
    for (int32_t i = 0; i < numUnits; i++) {
        auto& unit = units[i];
        if (uprv_strcmp(subType.data(), unit.getSubtype()) == 0) {
            macros.unit = unit;
            return;
        }
    }

    // throw new SkeletonSyntaxException("Unknown measure unit", segment);
    status = U_NUMBER_SKELETON_SYNTAX_ERROR;
}